

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O3

void __thiscall IRCCommand::~IRCCommand(IRCCommand *this)

{
  pointer pTVar1;
  pointer __dest;
  pointer ppIVar2;
  pointer __src;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_00113bc0;
  ppIVar2 = g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __dest = g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppIVar2 ==
        g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
LAB_0010c72d:
      std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>::
      ~vector(&this->m_channels);
      pTVar1 = (this->m_types).
               super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pTVar1 != (pointer)0x0) {
        operator_delete(pTVar1,(long)(this->m_types).
                                     super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pTVar1);
      }
      (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_00113ab0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&(this->super_Command).m_triggers);
      return;
    }
    __src = __dest + 1;
    if (*ppIVar2 == this) {
      ServerManager::removeCommand(serverManager,this);
      if (__src != g_IRCMasterCommandList.
                   super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
        memmove(__dest,__src,
                (long)g_IRCMasterCommandList.
                      super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src);
      }
      g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>._M_impl
      .super__Vector_impl_data._M_finish =
           g_IRCMasterCommandList.super__Vector_base<IRCCommand_*,_std::allocator<IRCCommand_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
      goto LAB_0010c72d;
    }
    ppIVar2 = ppIVar2 + 1;
    __dest = __src;
  } while( true );
}

Assistant:

IRCCommand::~IRCCommand() {
	// Remove any weak references to this
	for (auto itr = IRCMasterCommandList.begin(); itr != IRCMasterCommandList.end(); ++itr) {
		if (*itr == this) {
			serverManager->removeCommand(this);
			IRCMasterCommandList.erase(itr);
			break;
		}
	}
}